

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O1

void configuration_object_instantiate(configuration config,value v)

{
  size_t sVar1;
  value *ppvVar2;
  value *ppvVar3;
  char *key;
  size_t sVar4;
  
  sVar1 = value_type_count(v);
  ppvVar2 = value_to_map(v);
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      ppvVar3 = value_to_array(ppvVar2[sVar4]);
      key = value_to_string(*ppvVar3);
      set_insert(config->map,key,ppvVar3[1]);
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  config->v = v;
  return;
}

Assistant:

void configuration_object_instantiate(configuration config, value v)
{
	size_t index, size = value_type_count(v);

	value *v_map = value_to_map(v);

	for (index = 0; index < size; ++index)
	{
		value iterator = v_map[index];

		value *tupla = value_to_array(iterator);

		const char *key = value_to_string(tupla[0]);

		configuration_object_set(config, key, tupla[1]);
	}

	config->v = v;
}